

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  undefined6 in_register_0000000a;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  unsigned_short *in_stack_fffffffffffffe28;
  String local_1a0;
  Exception local_188;
  undefined1 local_2a [2];
  char *pcStack_28;
  uint16_t methodId_local;
  uint64_t typeId_local;
  char *interfaceName_local;
  Server *this_local;
  
  pcStack_28 = (char *)CONCAT62(in_register_0000000a,methodId);
  typeId_local = typeId;
  interfaceName_local = interfaceName;
  this_local = this;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            (&local_1a0,(Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&typeId_local,&stack0xffffffffffffffd8,
             (unsigned_long *)local_2a,in_stack_fffffffffffffe28);
  kj::Exception::Exception
            (&local_188,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x50,&local_1a0);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_188);
  kj::Exception::~Exception(&local_188);
  kj::String::~String(&local_1a0);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId);
}